

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O0

double MSH::vol_tetrahedron(node *a,node *b,node *c,node *d)

{
  double *U;
  double extraout_XMM0_Qa;
  double volume;
  node b_minus_d_X_c_minus_d;
  node c_minus_d;
  node b_minus_d;
  node a_minus_d;
  node *d_local;
  node *c_local;
  node *b_local;
  node *a_local;
  
  node::node((node *)&b_minus_d.z);
  node::node((node *)&c_minus_d.z);
  node::node((node *)&b_minus_d_X_c_minus_d.z);
  b_minus_d.z = a->x - d->x;
  c_minus_d.z = b->x - d->x;
  b_minus_d.x = b->y - d->y;
  b_minus_d.y = b->z - d->z;
  b_minus_d_X_c_minus_d.z = c->x - d->x;
  c_minus_d.x = c->y - d->y;
  c_minus_d.y = c->z - d->z;
  node::node((node *)&volume);
  cross_product((node *)&c_minus_d.z,(node *)&b_minus_d_X_c_minus_d.z,(node *)&volume);
  U = &b_minus_d.z;
  dot_product((node *)U,(node *)&volume);
  std::abs((int)U);
  return extraout_XMM0_Qa / 6.0;
}

Assistant:

double MSH::vol_tetrahedron(const node &a, const node &b, const node &c, const node &d)
{
    node a_minus_d, b_minus_d, c_minus_d;
    a_minus_d.x = a.x - d.x;
    a_minus_d.y = a.y - d.y;
    a_minus_d.z = a.z - d.z;
    b_minus_d.x = b.x - d.x;
    b_minus_d.y = b.y - d.y;
    b_minus_d.z = b.z - d.z;
    c_minus_d.x = c.x - d.x;
    c_minus_d.y = c.y - d.y;
    c_minus_d.z = c.z - d.z;
    node b_minus_d_X_c_minus_d;
    cross_product(b_minus_d,c_minus_d, b_minus_d_X_c_minus_d);
    double volume = std::abs(dot_product(a_minus_d,b_minus_d_X_c_minus_d))/6;
    return volume;
}